

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O3

avl_node * avl_find_greaterequal(avl_tree *tree,void *key)

{
  _func_int_void_ptr_void_ptr *p_Var1;
  int iVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  
  if (tree->root == (avl_node *)0x0) {
    return (avl_node *)0x0;
  }
  p_Var1 = tree->comp;
  paVar4 = tree->root;
  do {
    while( true ) {
      paVar3 = paVar4;
      iVar2 = (*p_Var1)(key,paVar3->key);
      if (-1 < iVar2) break;
      paVar4 = paVar3->left;
      if (paVar3->left == (avl_node *)0x0) goto LAB_00103afa;
    }
    if (iVar2 == 0) goto LAB_00103afa;
    paVar4 = paVar3->right;
  } while (paVar3->right != (avl_node *)0x0);
  do {
    if ((avl_node *)(tree->list_head).prev == paVar3) {
      return (avl_node *)0x0;
    }
    paVar3 = (avl_node *)(paVar3->list).next;
    iVar2 = (*tree->comp)(key,paVar3->key);
  } while (0 < iVar2);
LAB_00103afa:
  do {
    paVar4 = paVar3;
    if ((avl_node *)(tree->list_head).next == paVar4) {
      return paVar4;
    }
    paVar3 = (avl_node *)(paVar4->list).prev;
    iVar2 = (*tree->comp)(key,paVar3->key);
  } while (iVar2 < 1);
  return paVar4;
}

Assistant:

struct avl_node *
avl_find_greaterequal(const struct avl_tree *tree, const void *key) {
  struct avl_node *node, *next;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  /* go right as long as key>node.key */
  while (diff > 0) {
    if (list_is_last(&tree->list_head, &node->list)) {
      return NULL;
    }

    node = (struct avl_node *)node->list.next;
    diff = (*tree->comp)(key, node->key);
  }

  /* go left as long as key<=next_node.key */
  next = node;
  while (diff <= 0) {
    node = next;
    if (list_is_first(&tree->list_head, &node->list)) {
      break;
    }

    next = (struct avl_node *)node->list.prev;
    diff = (*tree->comp)(key, next->key);
  }
  return node;
}